

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendValueInternal<short,duckdb::uhugeint_t>
          (BaseAppender *this,Vector *col,short input)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  bool bVar3;
  unkbyte10 Var4;
  uhugeint_t result;
  uhugeint_t local_48;
  string local_38;
  
  bVar3 = TryCast::Operation<short,duckdb::uhugeint_t>(input,&local_48,false);
  if (bVar3) {
    pdVar1 = col->data;
    iVar2 = (this->chunk).count;
    *(uint64_t *)(pdVar1 + iVar2 * 0x10) = local_48.lower;
    *(uint64_t *)((long)(pdVar1 + iVar2 * 0x10) + 8) = local_48.upper;
    return;
  }
  Var4 = __cxa_allocate_exception(0x10);
  CastExceptionText<short,duckdb::uhugeint_t>
            (&local_38,(duckdb *)(ulong)(uint)(int)input,(short)((unkuint10)Var4 >> 0x40));
  InvalidInputException::InvalidInputException((InvalidInputException *)Var4,(string *)&local_38);
  __cxa_throw((InvalidInputException *)Var4,&InvalidInputException::typeinfo,
              ::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}